

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_msg.c
# Opt level: O1

void send_loc_info(char *file,int line)

{
  FILE *fdes;
  LocMsg lmsg;
  CheckMsg local_18;
  
  local_18.loc_msg.file = strdup(file);
  fdes = send_file2;
  local_18.loc_msg.line = line;
  if ((send_file2 == (FILE *)0x0) && (fdes = send_file1, send_file1 == (FILE *)0x0)) {
    eprintf("Unable to report test progress or a failure; was an ck_assert or ck_abort function called while not running tests?"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_msg.c"
            ,0x50);
  }
  ppack(fdes,CK_MSG_LOC,&local_18);
  free(local_18.loc_msg.file);
  return;
}

Assistant:

void send_loc_info(const char *file, int line)
{
    LocMsg lmsg;

    lmsg.file = strdup(file);
    lmsg.line = line;
    ppack(get_pipe(), CK_MSG_LOC, (CheckMsg *) & lmsg);
    free(lmsg.file);
}